

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
::
move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
                 table,size_t oldPos,size_t newPos,uint *params)

{
  bool bVar1;
  uint hash;
  size_t sVar2;
  HashBucket *this_00;
  HashBucket *bucket;
  uint i;
  uint hashCode;
  uint *params_local;
  size_t newPos_local;
  size_t oldPos_local;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
  *this_local;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
  table_local;
  
  hash = HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks::
         hashCode<unsigned_int&>((Callbacks *)this,params);
  sVar2 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)(this + 0x10));
  bucket._0_4_ = kj::_::chooseBucket(hash,(uint)sVar2);
  while( true ) {
    this_00 = Array<kj::_::HashBucket>::operator[]
                        ((Array<kj::_::HashBucket> *)(this + 0x10),(ulong)(uint)bucket);
    bVar1 = kj::_::HashBucket::isPos(this_00,(uint)oldPos);
    if (bVar1) {
      kj::_::HashBucket::setPos(this_00,(uint)newPos);
      return;
    }
    bVar1 = kj::_::HashBucket::isEmpty(this_00);
    if (bVar1) break;
    sVar2 = kj::_::probeHash((Array<kj::_::HashBucket> *)(this + 0x10),(ulong)(uint)bucket);
    bucket._0_4_ = (uint)sVar2;
  }
  kj::_::logHashTableInconsistency();
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }